

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper * __thiscall
Js::JavascriptLibrary::CreateAlreadyCalledWrapper_TTD
          (JavascriptLibrary *this,ScriptContext *ctx,bool value)

{
  Recycler *alloc;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *pJVar1;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  local_38 = (undefined1  [8])
             &JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_765c5cc;
  data.filename._0_4_ = 0x1625;
  alloc = Memory::Recycler::TrackAllocInfo(ctx->recycler,(TrackAllocData *)local_38);
  pJVar1 = (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)
           new<Memory::Recycler>(1,alloc,0x56b216);
  pJVar1->alreadyResolved = value;
  return pJVar1;
}

Assistant:

JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* JavascriptLibrary::CreateAlreadyCalledWrapper_TTD(Js::ScriptContext* ctx, bool value)
    {
        JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper = RecyclerNewStructZ(ctx->GetRecycler(), JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper);
        alreadyCalledWrapper->alreadyResolved = value;

        return alreadyCalledWrapper;
    }